

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

string * __thiscall
soul::SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
          (string *__return_storage_ptr__,SourceCodeUtilities *this,Comment *summary)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  size_type len1;
  ulong uVar4;
  bool bVar5;
  string firstLine;
  long *local_d0;
  ulong local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  undefined8 uStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((*this == (SourceCodeUtilities)0x1) &&
     (plVar1 = *(long **)(this + 8), plVar1 != *(long **)(this + 0x10))) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar1,plVar1[1] + *plVar1);
    choc::text::trim(&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_d0 = (long *)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    uVar2 = local_c8;
    plVar1 = local_d0;
    if (local_c8 != 0) {
      uVar4 = 0;
      do {
        iVar3 = tolower((int)*(char *)((long)plVar1 + uVar4));
        *(char *)((long)plVar1 + uVar4) = (char)iVar3;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    uVar2 = local_c8;
    if (local_d0 == (long *)&local_c0) {
      uStack_98 = uStack_b8;
      local_d0 = &local_a0;
    }
    local_a0 = CONCAT71(uStack_bf,local_c0);
    local_a8 = local_c8;
    local_c8 = 0;
    local_c0 = 0;
    if (uVar2 < 6) {
      bVar5 = false;
    }
    else {
      bVar5 = *(short *)((long)local_d0 + 4) == 0x3a65 && (int)*local_d0 == 0x6c746974;
    }
    plVar1 = (long *)&local_c0;
    local_b0 = local_d0;
    if ((local_d0 != &local_a0) &&
       (local_d0 = (long *)&local_c0, operator_delete(local_b0,local_a0 + 1), plVar1 = local_d0,
       local_d0 != (long *)&local_c0)) {
      operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      plVar1 = local_d0;
    }
    local_d0 = plVar1;
    if (bVar5) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
      choc::text::trim(__return_storage_ptr__,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((__return_storage_ptr__->_M_string_length != 0) &&
         ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          == '.')) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeUtilities::getFileSummaryTitle (const Comment& summary)
{
    if (summary.valid && ! summary.lines.empty())
    {
        auto firstLine = choc::text::trim (summary.lines[0]);

        if (choc::text::startsWith (toLowerCase (firstLine), "title:"))
        {
            auto title = choc::text::trim (firstLine.substr (6));

            if (choc::text::endsWith (title, "."))
                title = title.substr (title.length() - 1);

            return title;
        }
    }

    return {};
}